

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::WastParser::ResolveRefTypes
                 (Module *module,TypeVector *types,ReferenceVars *ref_vars,Errors *errors)

{
  anon_union_32_2_9f84448a_for_Var_2 *__k;
  pointer pRVar1;
  pointer pTVar2;
  Type TVar3;
  const_iterator cVar4;
  ulong uVar5;
  pointer pRVar6;
  ErrorLevel local_64;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_60;
  vector<wabt::Error,std::allocator<wabt::Error>> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pRVar6 = (ref_vars->
           super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (ref_vars->
           super__Vector_base<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar1) {
    local_60 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                *)&module->type_bindings;
    local_58 = (vector<wabt::Error,std::allocator<wabt::Error>> *)errors;
    do {
      uVar5 = (ulong)pRVar6->index;
      if (uVar5 != 0xffffffff) {
        pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) <= uVar5) {
          __assert_fail("index < types->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0x51e,
                        "static Result wabt::WastParser::ResolveRefTypes(const Module &, TypeVector *, ReferenceVars *, Errors *)"
                       );
        }
        TVar3 = pTVar2[uVar5];
        pRVar6->index = 0xffffffff;
        if (TVar3.enum_ != Reference) {
          __assert_fail("type.IsReferenceWithIndex()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0x522,
                        "static Result wabt::WastParser::ResolveRefTypes(const Module &, TypeVector *, ReferenceVars *, Errors *)"
                       );
        }
        if (0xfffffffeffffffff < (ulong)TVar3) {
          if ((pRVar6->var).type_ != Name) {
LAB_001318b2:
            __assert_fail("is_name()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                          ,0x3f,"const std::string &wabt::Var::name() const");
          }
          __k = &(pRVar6->var).field_2;
          cVar4 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                  ::find(local_60,&__k->name_);
          if ((cVar4.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
               ._M_cur == (__node_type *)0x0) ||
             (*(uint *)((long)cVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
                              ._M_cur + 0x48) == 0xffffffff)) {
            local_64 = Error;
            if ((pRVar6->var).type_ != Name) goto LAB_001318b2;
            StringPrintf_abi_cxx11_
                      (&local_50,"undefined reference type name %s",(__k->name_)._M_dataplus._M_p);
            std::vector<wabt::Error,std::allocator<wabt::Error>>::
            emplace_back<wabt::ErrorLevel,wabt::Location&,std::__cxx11::string>
                      (local_58,&local_64,&(pRVar6->var).loc,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar5] =
                 (Type)((ulong)*(uint *)((long)cVar4.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
                                               ._M_cur + 0x48) << 0x20 | 0xffffffeb);
          }
        }
      }
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ResolveRefTypes(const Module& module,
                                   TypeVector* types,
                                   ReferenceVars* ref_vars,
                                   Errors* errors) {
  Result result = Result::Ok;

  for (auto& ref_var : *ref_vars) {
    uint32_t index = ref_var.index;

    // The index of resolved variables is converted to kInvalidIndex.
    if (index == kInvalidIndex) {
      continue;
    }

    assert(index < types->size());
    Type type = (*types)[index];
    ref_var.index = kInvalidIndex;

    assert(type.IsReferenceWithIndex());

    if (type.GetReferenceIndex() != kInvalidIndex) {
      continue;
    }

    const auto type_index = module.type_bindings.FindIndex(ref_var.var.name());

    if (type_index == kInvalidIndex) {
      errors->emplace_back(ErrorLevel::Error, ref_var.var.loc,
                           StringPrintf("undefined reference type name %s",
                                        ref_var.var.name().c_str()));
      result = Result::Error;
      continue;
    }

    (*types)[index] = Type(static_cast<Type::Enum>(type), type_index);
  }

  return Result::Ok;
}